

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickhull.cpp
# Opt level: O0

bool __thiscall
test_quickhull<double,_std::forward_list<double,_std::allocator<double>_>,_std::forward_list<std::forward_list<double,_std::allocator<double>_>,_std::allocator<std::forward_list<double,_std::allocator<double>_>_>_>_>
::gnuplot::output(gnuplot *this,ostream *_out)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  facets *pfVar4;
  reference p_Var5;
  reference pdVar6;
  reference pfVar7;
  reference this_00;
  const_reference this_01;
  reference pfVar8;
  reference this_02;
  reference pdVar9;
  double *coordinate__5;
  iterator __end0_12;
  iterator __begin0_12;
  forward_list<double,_std::allocator<double>_> *__range5;
  _Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_> *v_1;
  const_iterator __end0_11;
  const_iterator __begin0_11;
  point_deque *__range4_4;
  double *coordinate__4;
  iterator __end0_10;
  iterator __begin0_10;
  forward_list<double,_std::allocator<double>_> *__range3_4;
  double *coordinate__3;
  iterator __end0_9;
  iterator __begin0_9;
  forward_list<double,_std::allocator<double>_> *__range4_3;
  _Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_> *vertex_;
  const_iterator __end0_8;
  const_iterator __begin0_8;
  point_array *__range3_3;
  point_array *vertices_;
  facet *facet__1;
  const_iterator __end0_7;
  const_iterator __begin0_7;
  facets *__range2_1;
  double *coordinate__2;
  const_iterator __end0_6;
  const_iterator __begin0_6;
  forward_list<double,_std::allocator<double>_> *__range4_2;
  forward_list<double,_std::allocator<double>_> *point__2;
  _Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_> *p_1;
  const_iterator __end0_5;
  const_iterator __begin0_5;
  point_list *__range3_2;
  size_type i;
  double *coordinate__1;
  const_iterator __end0_4;
  const_iterator __begin0_4;
  forward_list<double,_std::allocator<double>_> *__range4_1;
  forward_list<double,_std::allocator<double>_> *point__1;
  _Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_> *p;
  const_iterator __end0_3;
  const_iterator __begin0_3;
  point_list *__range3_1;
  double *coordinate_;
  const_iterator __end0_2;
  const_iterator __begin0_2;
  forward_list<double,_std::allocator<double>_> *__range4;
  forward_list<double,_std::allocator<double>_> *point_;
  _Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_> *v;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  point_list *__range3;
  facet *facet_;
  const_iterator __end0;
  const_iterator __begin0;
  facets *__range2;
  ostream *_out_local;
  gnuplot *this_local;
  
  bVar1 = ::test_quickhull::gnuplot::operator_cast_to_bool((gnuplot *)this);
  if (bVar1) {
    poVar2 = std::operator<<(this->log_,"dimensionality value ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->quick_hull_).dimension_);
    poVar2 = std::operator<<(poVar2," is out of supported range: cannot generate output");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  else {
    if ((this->f & 1U) == 0) {
      std::operator<<(_out,
                      "pause mouse\n\nclear\nset xrange restore\nset yrange restore\nset zrange restore\n"
                     );
    }
    else {
      this->f = false;
      std::operator<<(_out,
                      "set view equal xyz\nset autoscale\nset key left\nset xrange [] writeback\nset yrange [] writeback\nset zrange [] writeback\n"
                     );
    }
    poVar2 = std::operator<<(_out,"set title \'Points count is ");
    sVar3 = std::__cxx11::
            list<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
            ::size(&this->universe_);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
    std::operator<<(poVar2,"\'\n");
    if ((this->quick_hull_).dimension_ == 2) {
      std::operator<<(_out,"plot");
    }
    else if ((this->quick_hull_).dimension_ == 3) {
      std::operator<<(_out,"splot");
    }
    std::operator<<(_out,
                    " \'-\' with points notitle pointtype 4 pointsize 1.5 linetype 1, \'-\' with points notitle, \'-\' with labels offset character 0, character 1 notitle"
                   );
    pfVar4 = &(this->quick_hull_).facets_;
    std::
    deque<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_std::allocator<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet>_>
    ::begin((const_iterator *)&__end0._M_node,pfVar4);
    std::
    deque<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_std::allocator<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet>_>
    ::end((const_iterator *)&facet_,pfVar4);
    while (bVar1 = std::operator!=((_Self *)&__end0._M_node,(_Self *)&facet_), bVar1) {
      pfVar7 = std::
               _Deque_iterator<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_const_quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet_&,_const_quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet_*>
               ::operator*((_Deque_iterator<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_const_quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet_&,_const_quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet_*>
                            *)&__end0._M_node);
      std::operator<<(_out,", \'-\' with lines notitle");
      bVar1 = std::
              deque<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
              ::empty(&pfVar7->coplanar_);
      if (!bVar1) {
        std::operator<<(_out,", \'-\' with points notitle pointtype 6 pointsize 1.5 linetype 4");
      }
      std::
      _Deque_iterator<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_const_quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet_&,_const_quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet_*>
      ::operator++((_Deque_iterator<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_const_quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet_&,_const_quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet_*>
                    *)&__end0._M_node);
    }
    std::operator<<(_out,";\n");
    __end0_1 = std::__cxx11::
               list<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
               ::begin(&this->initial_simplex_);
    v = (_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_> *)
        std::__cxx11::
        list<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
        ::end(&this->initial_simplex_);
    while (bVar1 = std::operator!=(&__end0_1,(_Self *)&v), bVar1) {
      p_Var5 = std::
               _List_const_iterator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>
               ::operator*(&__end0_1);
      pfVar8 = std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>::
               operator*(p_Var5);
      __end0_2 = std::forward_list<double,_std::allocator<double>_>::begin(pfVar8);
      coordinate_ = (double *)std::forward_list<double,_std::allocator<double>_>::end(pfVar8);
      while (bVar1 = std::operator!=(&__end0_2,(_Self *)&coordinate_), bVar1) {
        pdVar6 = std::_Fwd_list_const_iterator<double>::operator*(&__end0_2);
        poVar2 = (ostream *)std::ostream::operator<<(_out,*pdVar6);
        std::operator<<(poVar2,' ');
        std::_Fwd_list_const_iterator<double>::operator++(&__end0_2);
      }
      std::operator<<(_out,'\n');
      std::
      _List_const_iterator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>
      ::operator++(&__end0_1);
    }
    std::operator<<(_out,"e\n");
    __end0_3 = std::__cxx11::
               list<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
               ::begin(&this->universe_);
    p = (_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_> *)
        std::__cxx11::
        list<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
        ::end(&this->universe_);
    while (bVar1 = std::operator!=(&__end0_3,(_Self *)&p), bVar1) {
      p_Var5 = std::
               _List_const_iterator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>
               ::operator*(&__end0_3);
      pfVar8 = std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>::
               operator*(p_Var5);
      __end0_4 = std::forward_list<double,_std::allocator<double>_>::begin(pfVar8);
      coordinate__1 = (double *)std::forward_list<double,_std::allocator<double>_>::end(pfVar8);
      while (bVar1 = std::operator!=(&__end0_4,(_Self *)&coordinate__1), bVar1) {
        pdVar6 = std::_Fwd_list_const_iterator<double>::operator*(&__end0_4);
        poVar2 = (ostream *)std::ostream::operator<<(_out,*pdVar6);
        std::operator<<(poVar2,' ');
        std::_Fwd_list_const_iterator<double>::operator++(&__end0_4);
      }
      std::operator<<(_out,'\n');
      std::
      _List_const_iterator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>
      ::operator++(&__end0_3);
    }
    std::operator<<(_out,"e\n");
    __range3_2 = (point_list *)0x0;
    __end0_5 = std::__cxx11::
               list<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
               ::begin(&this->universe_);
    p_1 = (_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_> *)
          std::__cxx11::
          list<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
          ::end(&this->universe_);
    while (bVar1 = std::operator!=(&__end0_5,(_Self *)&p_1), bVar1) {
      p_Var5 = std::
               _List_const_iterator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>
               ::operator*(&__end0_5);
      pfVar8 = std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>::
               operator*(p_Var5);
      __end0_6 = std::forward_list<double,_std::allocator<double>_>::begin(pfVar8);
      coordinate__2 = (double *)std::forward_list<double,_std::allocator<double>_>::end(pfVar8);
      while (bVar1 = std::operator!=(&__end0_6,(_Self *)&coordinate__2), bVar1) {
        pdVar6 = std::_Fwd_list_const_iterator<double>::operator*(&__end0_6);
        poVar2 = (ostream *)std::ostream::operator<<(_out,*pdVar6);
        std::operator<<(poVar2,' ');
        std::_Fwd_list_const_iterator<double>::operator++(&__end0_6);
      }
      poVar2 = (ostream *)std::ostream::operator<<(_out,(ulong)__range3_2);
      std::operator<<(poVar2,'\n');
      __range3_2 = (point_list *)
                   ((long)&(__range3_2->
                           super__List_base<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
                           )._M_impl._M_node.super__List_node_base._M_next + 1);
      std::
      _List_const_iterator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>
      ::operator++(&__end0_5);
    }
    std::operator<<(_out,"e\n");
    pfVar4 = &(this->quick_hull_).facets_;
    std::
    deque<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_std::allocator<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet>_>
    ::begin((const_iterator *)&__end0_7._M_node,pfVar4);
    std::
    deque<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_std::allocator<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet>_>
    ::end((const_iterator *)&facet__1,pfVar4);
    while (bVar1 = std::operator!=((_Self *)&__end0_7._M_node,(_Self *)&facet__1), bVar1) {
      pfVar7 = std::
               _Deque_iterator<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_const_quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet_&,_const_quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet_*>
               ::operator*((_Deque_iterator<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_const_quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet_&,_const_quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet_*>
                            *)&__end0_7._M_node);
      __end0_8 = std::
                 vector<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
                 ::begin(&pfVar7->vertices_);
      vertex_ = (_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_> *)
                std::
                vector<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
                ::end(&pfVar7->vertices_);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end0_8,
                                (__normal_iterator<const_std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_*,_std::vector<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>_>
                                 *)&vertex_), bVar1) {
        this_00 = __gnu_cxx::
                  __normal_iterator<const_std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_*,_std::vector<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>_>
                  ::operator*(&__end0_8);
        pfVar8 = std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>::
                 operator*(this_00);
        __end0_9 = std::forward_list<double,_std::allocator<double>_>::begin(pfVar8);
        coordinate__3 = (double *)std::forward_list<double,_std::allocator<double>_>::end(pfVar8);
        while (bVar1 = std::operator!=(&__end0_9,(_Self *)&coordinate__3), bVar1) {
          pdVar9 = std::_Fwd_list_iterator<double>::operator*(&__end0_9);
          poVar2 = (ostream *)std::ostream::operator<<(_out,*pdVar9);
          std::operator<<(poVar2,' ');
          std::_Fwd_list_iterator<double>::operator++(&__end0_9);
        }
        std::operator<<(_out,'\n');
        __gnu_cxx::
        __normal_iterator<const_std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_*,_std::vector<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>_>
        ::operator++(&__end0_8);
      }
      this_01 = std::
                vector<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
                ::front(&pfVar7->vertices_);
      pfVar8 = std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>::
               operator*(this_01);
      __end0_10 = std::forward_list<double,_std::allocator<double>_>::begin(pfVar8);
      coordinate__4 = (double *)std::forward_list<double,_std::allocator<double>_>::end(pfVar8);
      while (bVar1 = std::operator!=(&__end0_10,(_Self *)&coordinate__4), bVar1) {
        pdVar9 = std::_Fwd_list_iterator<double>::operator*(&__end0_10);
        poVar2 = (ostream *)std::ostream::operator<<(_out,*pdVar9);
        std::operator<<(poVar2,' ');
        std::_Fwd_list_iterator<double>::operator++(&__end0_10);
      }
      std::operator<<(_out,"\ne\n");
      bVar1 = std::
              deque<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
              ::empty(&pfVar7->coplanar_);
      if (!bVar1) {
        std::
        deque<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
        ::begin((const_iterator *)&__end0_11._M_node,&pfVar7->coplanar_);
        std::
        deque<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
        ::end((const_iterator *)&v_1,&pfVar7->coplanar_);
        while (bVar1 = std::operator!=((_Self *)&__end0_11._M_node,(_Self *)&v_1), bVar1) {
          this_02 = std::
                    _Deque_iterator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_const_std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_&,_const_std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_*>
                    ::operator*((_Deque_iterator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_const_std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_&,_const_std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_*>
                                 *)&__end0_11._M_node);
          pfVar8 = std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>::
                   operator*(this_02);
          __end0_12 = std::forward_list<double,_std::allocator<double>_>::begin(pfVar8);
          coordinate__5 = (double *)std::forward_list<double,_std::allocator<double>_>::end(pfVar8);
          while (bVar1 = std::operator!=(&__end0_12,(_Self *)&coordinate__5), bVar1) {
            pdVar9 = std::_Fwd_list_iterator<double>::operator*(&__end0_12);
            poVar2 = (ostream *)std::ostream::operator<<(_out,*pdVar9);
            std::operator<<(poVar2,' ');
            std::_Fwd_list_iterator<double>::operator++(&__end0_12);
          }
          std::operator<<(_out,'\n');
          std::
          _Deque_iterator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_const_std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_&,_const_std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_*>
          ::operator++((_Deque_iterator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_const_std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_&,_const_std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_*>
                        *)&__end0_11._M_node);
        }
        std::operator<<(_out,"e\n");
      }
      std::
      _Deque_iterator<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_const_quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet_&,_const_quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet_*>
      ::operator++((_Deque_iterator<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_const_quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet_&,_const_quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet_*>
                    *)&__end0_7._M_node);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
        output(std::ostream & _out) const
        {
            if (operator bool ()) {
                log_ << "dimensionality value " << quick_hull_.dimension_
                     << " is out of supported range: cannot generate output" << std::endl;
                return false;
            }
            if (f) {
                f = false;
                _out << "set view equal xyz\n"
                        "set autoscale\n"
                        "set key left\n"
                        "set xrange [] writeback\n"
                        "set yrange [] writeback\n"
                        "set zrange [] writeback\n";
            } else {
                _out << "pause mouse\n\n"
                        "clear\n"
                        "set xrange restore\n"
                        "set yrange restore\n"
                        "set zrange restore\n";
            }